

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

string * testing::internal::UnitTestOptions::GetOutputFormat_abi_cxx11_(void)

{
  char *pcVar1;
  ulong uVar2;
  string *in_RDI;
  char *colon;
  char *gtest_output_flag;
  string s;
  allocator local_4d [19];
  byte local_3a;
  allocator local_39;
  char *local_38;
  char *local_30;
  string local_28 [40];
  
  std::__cxx11::string::string(local_28,(string *)FLAGS_gtest_output_abi_cxx11_);
  local_30 = (char *)std::__cxx11::string::c_str();
  local_38 = strchr(local_30,0x3a);
  pcVar1 = local_30;
  local_3a = 0;
  if (local_38 == (char *)0x0) {
    std::allocator<char>::allocator();
    local_3a = 1;
    std::__cxx11::string::string((string *)in_RDI,pcVar1,&local_39);
  }
  else {
    uVar2 = (long)local_38 - (long)local_30;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,pcVar1,uVar2,local_4d);
    std::allocator<char>::~allocator((allocator<char> *)local_4d);
  }
  if ((local_3a & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  std::__cxx11::string::~string(local_28);
  return in_RDI;
}

Assistant:

std::string UnitTestOptions::GetOutputFormat() {
  std::string s = GTEST_FLAG_GET(output);
  const char* const gtest_output_flag = s.c_str();
  const char* const colon = strchr(gtest_output_flag, ':');
  return (colon == nullptr)
             ? std::string(gtest_output_flag)
             : std::string(gtest_output_flag,
                           static_cast<size_t>(colon - gtest_output_flag));
}